

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZAnalyticSolution.cpp
# Opt level: O3

void __thiscall
TLaplaceExampleTimeDependent::Permeability<Fad<double>>
          (TLaplaceExampleTimeDependent *this,TPZVec<Fad<double>_> *x,Fad<double> *Perm)

{
  Fad<double> local_28;
  
  local_28.val_ = this->fK;
  local_28.dx_.num_elts = 0;
  local_28.dx_.ptr_to_data = (double *)0x0;
  local_28.defaultVal = 0.0;
  Perm->val_ = local_28.val_;
  Vector<double>::operator=(&Perm->dx_,&local_28.dx_);
  Perm->defaultVal = local_28.defaultVal;
  Fad<double>::~Fad(&local_28);
  return;
}

Assistant:

void TLaplaceExampleTimeDependent::Permeability(const TPZVec<TVar> &x, TVar &Perm) const
{
    Perm = (TVar)(fK);
}